

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

bool __thiscall
ON_Font::Internal_SetFontCharacteristicsFromUnsigned
          (ON_Font *this,uint font_characteristics_as_unsigned)

{
  bool bVar1;
  wchar_t *gdi_logfont_name;
  bool bStrikethrough;
  bool bUnderlined;
  Style font_style;
  Stretch font_stretch;
  Weight font_weight;
  ON_wString windows_logfont_name;
  bool local_1d;
  bool local_1c;
  Style local_1b;
  Stretch local_1a;
  Weight local_19;
  
  local_19 = Normal;
  local_1a = Medium;
  local_1b = Upright;
  local_1c = false;
  local_1d = false;
  Internal_GetFontCharacteristicsFromUnsigned
            (font_characteristics_as_unsigned,&local_19,&local_1a,&local_1b,&local_1c,&local_1d);
  WindowsLogfontName((ON_Font *)&stack0xffffffffffffffe8);
  gdi_logfont_name = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&stack0xffffffffffffffe8);
  bVar1 = SetFontCharacteristics(this,gdi_logfont_name,local_19,local_1b,local_1a,local_1c,local_1d)
  ;
  ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffffe8);
  return bVar1;
}

Assistant:

bool ON_Font::Internal_SetFontCharacteristicsFromUnsigned(
  unsigned int font_characteristics_as_unsigned
  )
{
  ON_Font::Weight font_weight = ON_Font::Weight::Normal;
  ON_Font::Stretch font_stretch = ON_Font::Stretch::Medium;
  ON_Font::Style font_style = ON_Font::Style::Upright;
  bool bUnderlined = false;
  bool bStrikethrough = false;

  ON_Font::Internal_GetFontCharacteristicsFromUnsigned(
    font_characteristics_as_unsigned,
    font_weight,
    font_stretch,
    font_style,
    bUnderlined,
    bStrikethrough
    );


  const ON_wString windows_logfont_name = WindowsLogfontName();

  bool rc = SetFontCharacteristics(
    windows_logfont_name,
    font_weight,
    font_style,
    font_stretch,
    bUnderlined,
    bStrikethrough
  );

  return rc;
}